

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_fetching.c
# Opt level: O0

void CGTFS_DatabaseFetching(void)

{
  int iVar1;
  greatest_test_res local_44;
  greatest_test_res local_40;
  greatest_test_res res_14;
  greatest_test_res res_13;
  greatest_test_res res_12;
  greatest_test_res res_11;
  greatest_test_res res_10;
  greatest_test_res res_9;
  greatest_test_res res_8;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("db_all_agencies_fetch");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = db_all_agencies_fetch();
    }
    greatest_test_post(res_2);
  }
  iVar1 = greatest_test_pre("db_all_calendar_dates_fetch");
  if (iVar1 == 1) {
    res_3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_3 == GREATEST_TEST_RES_PASS) {
      res_3 = db_all_calendar_dates_fetch();
    }
    greatest_test_post(res_3);
  }
  iVar1 = greatest_test_pre("db_all_calendar_records_fetch");
  if (iVar1 == 1) {
    res_4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_4 == GREATEST_TEST_RES_PASS) {
      res_4 = db_all_calendar_records_fetch();
    }
    greatest_test_post(res_4);
  }
  iVar1 = greatest_test_pre("db_all_fare_attributes_fetch");
  if (iVar1 == 1) {
    res_5 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_5 == GREATEST_TEST_RES_PASS) {
      res_5 = db_all_fare_attributes_fetch();
    }
    greatest_test_post(res_5);
  }
  iVar1 = greatest_test_pre("db_all_fare_rules_fetch");
  if (iVar1 == 1) {
    res_6 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_6 == GREATEST_TEST_RES_PASS) {
      res_6 = db_all_fare_rules_fetch();
    }
    greatest_test_post(res_6);
  }
  iVar1 = greatest_test_pre("db_all_feed_info_fetch");
  if (iVar1 == 1) {
    res_7 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_7 == GREATEST_TEST_RES_PASS) {
      res_7 = db_all_feed_info_fetch();
    }
    greatest_test_post(res_7);
  }
  iVar1 = greatest_test_pre("db_all_frequencies_fetch");
  if (iVar1 == 1) {
    res_8 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_8 == GREATEST_TEST_RES_PASS) {
      res_8 = db_all_frequencies_fetch();
    }
    greatest_test_post(res_8);
  }
  iVar1 = greatest_test_pre("db_all_levels_fetch");
  if (iVar1 == 1) {
    res_9 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_9 == GREATEST_TEST_RES_PASS) {
      res_9 = db_all_levels_fetch();
    }
    greatest_test_post(res_9);
  }
  iVar1 = greatest_test_pre("db_all_pathways_fetch");
  if (iVar1 == 1) {
    res_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_10 == GREATEST_TEST_RES_PASS) {
      res_10 = db_all_pathways_fetch();
    }
    greatest_test_post(res_10);
  }
  iVar1 = greatest_test_pre("db_all_routes_fetch");
  if (iVar1 == 1) {
    res_11 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_11 == GREATEST_TEST_RES_PASS) {
      res_11 = db_all_routes_fetch();
    }
    greatest_test_post(res_11);
  }
  iVar1 = greatest_test_pre("db_all_shapes_fetch");
  if (iVar1 == 1) {
    res_12 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_12 == GREATEST_TEST_RES_PASS) {
      res_12 = db_all_shapes_fetch();
    }
    greatest_test_post(res_12);
  }
  iVar1 = greatest_test_pre("db_all_stop_times_fetch");
  if (iVar1 == 1) {
    res_13 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_13 == GREATEST_TEST_RES_PASS) {
      res_13 = db_all_stop_times_fetch();
    }
    greatest_test_post(res_13);
  }
  iVar1 = greatest_test_pre("db_all_stops_fetch");
  if (iVar1 == 1) {
    res_14 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_14 == GREATEST_TEST_RES_PASS) {
      res_14 = db_all_stops_fetch();
    }
    greatest_test_post(res_14);
  }
  iVar1 = greatest_test_pre("db_all_transfers_fetch");
  if (iVar1 == 1) {
    local_40 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_40 == GREATEST_TEST_RES_PASS) {
      local_40 = db_all_transfers_fetch();
    }
    greatest_test_post(local_40);
  }
  iVar1 = greatest_test_pre("db_all_trips_fetch");
  if (iVar1 == 1) {
    local_44 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_44 == GREATEST_TEST_RES_PASS) {
      local_44 = db_all_trips_fetch();
    }
    greatest_test_post(local_44);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseFetching) {
    RUN_TEST(db_all_agencies_fetch);
    RUN_TEST(db_all_calendar_dates_fetch);
    RUN_TEST(db_all_calendar_records_fetch);
    RUN_TEST(db_all_fare_attributes_fetch);
    RUN_TEST(db_all_fare_rules_fetch);
    RUN_TEST(db_all_feed_info_fetch);
    RUN_TEST(db_all_frequencies_fetch);
    RUN_TEST(db_all_levels_fetch);
    RUN_TEST(db_all_pathways_fetch);
    RUN_TEST(db_all_routes_fetch);
    RUN_TEST(db_all_shapes_fetch);
    RUN_TEST(db_all_stop_times_fetch);
    RUN_TEST(db_all_stops_fetch);
    RUN_TEST(db_all_transfers_fetch);
    RUN_TEST(db_all_trips_fetch);
}